

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBase::FillCMakeVariablePath(cmFindBase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  mapped_type *this_00;
  string var;
  string local_60;
  string local_40;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,&cmFindCommon::PathLabel::CMake);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAKE_","");
  std::__cxx11::string::_M_append
            ((char *)&local_40,(ulong)(this->super_cmFindCommon).CMakePathName._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_40);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_PREFIX_PATH","");
  cmSearchPath::AddCMakePrefixPath(this_00,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::AddCMakePath(this_00,&local_40);
  iVar2 = std::__cxx11::string::compare((char *)&(this->super_cmFindCommon).CMakePathName);
  if (iVar2 == 0) {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_APPBUNDLE_PATH","");
    cmSearchPath::AddCMakePath(this_00,&local_60);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"CMAKE_FRAMEWORK_PATH","");
    cmSearchPath::AddCMakePath(this_00,&local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  cmSearchPath::AddSuffixes(this_00,&(this->super_cmFindCommon).SearchPathSuffixes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindBase::FillCMakeVariablePath()
{
  cmSearchPath &paths = this->LabeledPaths[PathLabel::CMake];

  // Add CMake varibles of the same name as the previous environment
  // varibles CMAKE_*_PATH to be used most of the time with -D
  // command line options
  std::string var = "CMAKE_";
  var += this->CMakePathName;
  var += "_PATH";
  paths.AddCMakePrefixPath("CMAKE_PREFIX_PATH");
  paths.AddCMakePath(var);

  if(this->CMakePathName == "PROGRAM")
    {
    paths.AddCMakePath("CMAKE_APPBUNDLE_PATH");
    }
  else
    {
    paths.AddCMakePath("CMAKE_FRAMEWORK_PATH");
    }
  paths.AddSuffixes(this->SearchPathSuffixes);
}